

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimalintegration.cpp
# Opt level: O1

void __thiscall
QMinimalIntegration::QMinimalIntegration(QMinimalIntegration *this,QStringList *parameters)

{
  long lVar1;
  QString *pQVar2;
  long lVar3;
  uint uVar4;
  char cVar5;
  int iVar6;
  QMinimalScreen *this_00;
  uint uVar7;
  long lVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  
  *(undefined ***)this = &PTR__QMinimalIntegration_00108878;
  this->m_fontDatabase = (QPlatformFontDatabase *)0x0;
  (this->m_nativeInterface).d = (QPlatformNativeInterface *)0x0;
  lVar1 = (parameters->d).size;
  if (lVar1 == 0) {
    uVar7 = 0;
  }
  else {
    pQVar2 = (parameters->d).ptr;
    lVar8 = 0;
    uVar7 = 0;
    do {
      lVar3 = *(long *)((long)&(pQVar2->d).size + lVar8);
      if (lVar3 == 8) {
        QVar10.m_data = *(storage_type_conflict **)((long)&(pQVar2->d).ptr + lVar8);
        QVar10.m_size = 8;
        QVar13.m_data = "freetype";
        QVar13.m_size = 8;
        cVar5 = QtPrivate::equalStrings(QVar10,QVar13);
        if (cVar5 == '\0') {
LAB_00104f3f:
          cVar5 = '\0';
          goto LAB_00104f41;
        }
        uVar4 = uVar7 | 4;
      }
      else if (lVar3 == 10) {
        QVar11.m_data = *(storage_type_conflict **)((long)&(pQVar2->d).ptr + lVar8);
        QVar11.m_size = 10;
        QVar14.m_data = "fontconfig";
        QVar14.m_size = 10;
        cVar5 = QtPrivate::equalStrings(QVar11,QVar14);
LAB_00104f41:
        uVar4 = uVar7 | 8;
        if (cVar5 == '\0') {
          uVar4 = uVar7;
        }
      }
      else {
        if ((lVar3 != 0xc) ||
           (QVar9.m_data = *(storage_type_conflict **)((long)&(pQVar2->d).ptr + lVar8),
           QVar9.m_size = 0xc, QVar12.m_data = "enable_fonts", QVar12.m_size = 0xc,
           cVar5 = QtPrivate::equalStrings(QVar9,QVar12), cVar5 == '\0')) goto LAB_00104f3f;
        uVar4 = uVar7 | 2;
      }
      uVar7 = uVar4;
      lVar8 = lVar8 + 0x18;
    } while (lVar1 * 0x18 != lVar8);
  }
  this->m_options = uVar7;
  cVar5 = qEnvironmentVariableIsSet("QT_DEBUG_BACKINGSTORE");
  if ((cVar5 != '\0') &&
     (iVar6 = qEnvironmentVariableIntValue("QT_DEBUG_BACKINGSTORE",(bool *)0x0), 0 < iVar6)) {
    *(byte *)&this->m_options = (byte)this->m_options | 3;
  }
  this_00 = (QMinimalScreen *)operator_new(0x30);
  QPlatformScreen::QPlatformScreen((QPlatformScreen *)this_00);
  *(undefined ***)this_00 = &PTR__QPlatformScreen_001089b8;
  (this_00->mGeometry).x1 = 0;
  (this_00->mGeometry).y1 = 0;
  (this_00->mGeometry).x2 = -1;
  (this_00->mGeometry).y2 = -1;
  this_00->mDepth = 0x20;
  this_00->mFormat = Format_ARGB32_Premultiplied;
  this->m_primaryScreen = this_00;
  (this_00->mGeometry).x1 = 0;
  (this_00->mGeometry).y1 = 0;
  (this_00->mGeometry).x2 = 0xef;
  (this_00->mGeometry).y2 = 0x13f;
  this_00->mDepth = 0x20;
  this_00->mFormat = Format_ARGB32_Premultiplied;
  (this_00->mPhysicalSize).wd = -1;
  (this_00->mPhysicalSize).ht = -1;
  QWindowSystemInterface::handleScreenAdded((QPlatformScreen *)this_00,false);
  return;
}

Assistant:

QMinimalIntegration::QMinimalIntegration(const QStringList &parameters)
    : m_fontDatabase(nullptr)
    , m_options(parseOptions(parameters))
{
    if (qEnvironmentVariableIsSet(debugBackingStoreEnvironmentVariable)
        && qEnvironmentVariableIntValue(debugBackingStoreEnvironmentVariable) > 0) {
        m_options |= DebugBackingStore | EnableFonts;
    }

    m_primaryScreen = new QMinimalScreen();

    m_primaryScreen->mGeometry = QRect(0, 0, 240, 320);
    m_primaryScreen->mDepth = 32;
    m_primaryScreen->mFormat = QImage::Format_ARGB32_Premultiplied;

    QWindowSystemInterface::handleScreenAdded(m_primaryScreen);
}